

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tconcat(lua_State *L)

{
  int iVar1;
  char *s;
  lua_Integer lVar2;
  size_t sVar3;
  int local_2044;
  char *sep;
  int last;
  int i;
  size_t lsep;
  luaL_Buffer b;
  lua_State *L_local;
  
  b.buffer._8184_8_ = L;
  s = luaL_optlstring(L,2,"",(size_t *)&last);
  luaL_checktype((lua_State *)b.buffer._8184_8_,1,5);
  lVar2 = luaL_optinteger((lua_State *)b.buffer._8184_8_,3,1);
  sep._4_4_ = (int)lVar2;
  iVar1 = lua_type((lua_State *)b.buffer._8184_8_,4);
  if (iVar1 < 1) {
    sVar3 = lua_objlen((lua_State *)b.buffer._8184_8_,1);
    local_2044 = (int)sVar3;
  }
  else {
    lVar2 = luaL_checkinteger((lua_State *)b.buffer._8184_8_,4);
    local_2044 = (int)lVar2;
  }
  luaL_buffinit((lua_State *)b.buffer._8184_8_,(luaL_Buffer *)&lsep);
  for (; sep._4_4_ < local_2044; sep._4_4_ = sep._4_4_ + 1) {
    addfield((lua_State *)b.buffer._8184_8_,(luaL_Buffer *)&lsep,sep._4_4_);
    luaL_addlstring((luaL_Buffer *)&lsep,s,_last);
  }
  if (sep._4_4_ == local_2044) {
    addfield((lua_State *)b.buffer._8184_8_,(luaL_Buffer *)&lsep,sep._4_4_);
  }
  luaL_pushresult((luaL_Buffer *)&lsep);
  return 1;
}

Assistant:

static int tconcat (lua_State *L) {
  luaL_Buffer b;
  size_t lsep;
  int i, last;
  const char *sep = luaL_optlstring(L, 2, "", &lsep);
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 3, 1);
  last = luaL_opt(L, luaL_checkint, 4, luaL_getn(L, 1));
  luaL_buffinit(L, &b);
  for (; i < last; i++) {
    addfield(L, &b, i);
    luaL_addlstring(&b, sep, lsep);
  }
  if (i == last)  /* add last value (if interval was not empty) */
    addfield(L, &b, i);
  luaL_pushresult(&b);
  return 1;
}